

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

int __thiscall lsim::Simulator::init(Simulator *this,EVP_PKEY_CTX *ctx)

{
  value_type_conflict2 vVar1;
  bool bVar2;
  ComponentType CVar3;
  reference pNVar4;
  reference this_00;
  pointer this_01;
  reference ppSVar5;
  ModelComponent *this_02;
  reference this_03;
  ulong uVar6;
  size_type sVar7;
  value_type_conflict2 local_f4;
  reference pvStack_f0;
  node_t node;
  value_type *setup_func;
  SimComponent *comp_1;
  iterator __end1_2;
  iterator __begin1_2;
  component_refs_t *__range1_2;
  unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_> *comp;
  iterator __end1_1;
  iterator __begin1_1;
  component_container_t *__range1_1;
  NodeMetadata *meta;
  iterator __end1;
  iterator __begin1;
  node_metadata_container_t *__range1;
  unsigned_long *local_80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78;
  int local_6c;
  unsigned_long *local_68;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  int local_54;
  unsigned_long *local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  Value local_3c;
  Value *local_38;
  __normal_iterator<lsim::Value_*,_std::vector<lsim::Value,_std::allocator<lsim::Value>_>_> local_30
  ;
  Value local_24;
  Value *local_20;
  __normal_iterator<lsim::Value_*,_std::vector<lsim::Value,_std::allocator<lsim::Value>_>_> local_18
  ;
  Simulator *local_10;
  Simulator *this_local;
  
  this->m_time = 1;
  local_10 = this;
  local_18._M_current =
       (Value *)std::begin<std::vector<lsim::Value,std::allocator<lsim::Value>>>
                          (&this->m_node_values_read);
  local_20 = (Value *)std::end<std::vector<lsim::Value,std::allocator<lsim::Value>>>
                                (&this->m_node_values_read);
  local_24 = VALUE_FALSE;
  std::
  fill<__gnu_cxx::__normal_iterator<lsim::Value*,std::vector<lsim::Value,std::allocator<lsim::Value>>>,lsim::Value>
            (local_18,(__normal_iterator<lsim::Value_*,_std::vector<lsim::Value,_std::allocator<lsim::Value>_>_>
                       )local_20,&local_24);
  local_30._M_current =
       (Value *)std::begin<std::vector<lsim::Value,std::allocator<lsim::Value>>>
                          (&this->m_node_values_write);
  local_38 = (Value *)std::end<std::vector<lsim::Value,std::allocator<lsim::Value>>>
                                (&this->m_node_values_write);
  local_3c = VALUE_FALSE;
  std::
  fill<__gnu_cxx::__normal_iterator<lsim::Value*,std::vector<lsim::Value,std::allocator<lsim::Value>>>,lsim::Value>
            (local_30,(__normal_iterator<lsim::Value_*,_std::vector<lsim::Value,_std::allocator<lsim::Value>_>_>
                       )local_38,&local_3c);
  local_48._M_current =
       (unsigned_long *)
       std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                 (&this->m_node_write_time);
  local_50 = (unsigned_long *)
             std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this->m_node_write_time);
  local_54 = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (local_48,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )local_50,&local_54);
  local_60._M_current =
       (unsigned_long *)
       std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                 (&this->m_node_change_time);
  local_68 = (unsigned_long *)
             std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this->m_node_change_time);
  local_6c = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (local_60,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )local_68,&local_6c);
  local_78._M_current =
       (unsigned_long *)
       std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>(&this->m_input_changed);
  local_80 = (unsigned_long *)
             std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this->m_input_changed);
  __range1._4_4_ = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (local_78,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )local_80,(int *)((long)&__range1 + 4));
  __end1 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::begin
                     (&this->m_node_metadata);
  meta = (NodeMetadata *)
         std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::end
                   (&this->m_node_metadata);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<lsim::NodeMetadata_*,_std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>_>
                                *)&meta);
    if (!bVar2) break;
    pNVar4 = __gnu_cxx::
             __normal_iterator<lsim::NodeMetadata_*,_std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>_>
             ::operator*(&__end1);
    pNVar4->m_default = VALUE_UNDEFINED;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              (&pNVar4->m_active_pins);
    pNVar4->m_time_dirty_write = 0;
    __gnu_cxx::
    __normal_iterator<lsim::NodeMetadata_*,_std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
             ::begin(&this->m_components);
  comp = (unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_> *)
         std::
         vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
         ::end(&this->m_components);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_*,_std::vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>_>
                        *)&comp);
    if (!bVar2) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_*,_std::vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>_>
              ::operator*(&__end1_1);
    this_01 = std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>::
              operator->(this_00);
    SimComponent::apply_initial_values(this_01);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_*,_std::vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>::begin
                       (&this->m_init_components);
  comp_1 = (SimComponent *)
           std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>::end
                     (&this->m_init_components);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<lsim::SimComponent_**,_std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>_>
                        *)&comp_1);
    if (!bVar2) break;
    ppSVar5 = __gnu_cxx::
              __normal_iterator<lsim::SimComponent_**,_std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>_>
              ::operator*(&__end1_2);
    setup_func = (value_type *)*ppSVar5;
    this_02 = SimComponent::description((SimComponent *)setup_func);
    CVar3 = ModelComponent::type(this_02);
    this_03 = std::
              vector<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
              ::operator[](&this->m_sim_functions,(ulong)CVar3);
    pvStack_f0 = std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>::
                 operator[](this_03,0);
    std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::operator()
              (pvStack_f0,this,(SimComponent *)setup_func);
    __gnu_cxx::
    __normal_iterator<lsim::SimComponent_**,_std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>_>
    ::operator++(&__end1_2);
  }
  local_f4 = 0;
  while( true ) {
    vVar1 = local_f4;
    uVar6 = (ulong)local_f4;
    sVar7 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::size(&this->m_node_values_read);
    if (sVar7 <= uVar6) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_dirty_nodes_read,&local_f4);
    local_f4 = local_f4 + 1;
  }
  return vVar1;
}

Assistant:

void Simulator::init() {
    m_time = 1;

    std::fill(std::begin(m_node_values_read), std::end(m_node_values_read), VALUE_FALSE);
    std::fill(std::begin(m_node_values_write), std::end(m_node_values_write), VALUE_FALSE);
    std::fill(std::begin(m_node_write_time), std::end(m_node_write_time), 0);
    std::fill(std::begin(m_node_change_time), std::end(m_node_change_time), 0);
	std::fill(std::begin(m_input_changed), std::end(m_input_changed), 0);

    for (auto &meta : m_node_metadata) {
        meta.m_default = VALUE_UNDEFINED;
		meta.m_active_pins.clear();
		meta.m_time_dirty_write = 0;
    }

    // apply initial values
    for (auto &comp : m_components) {
		comp->apply_initial_values();
    }

    // run one time setup functions
    for (auto comp : m_init_components) {
        auto &setup_func = m_sim_functions[comp->description()->type()][SIM_FUNCTION_SETUP];
        setup_func(this, comp);
    }

    // mark all nodes as dirty for the first run
    for (node_t node = 0; node < m_node_values_read.size(); ++node) {
        m_dirty_nodes_read.push_back(node);
    }
}